

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

int proxy_authorize_callsign(proxy_handle *ph,char *callsign)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  int ret;
  proxy_priv *priv;
  char *callsign_local;
  proxy_handle *ph_local;
  
  pvVar1 = ph->priv;
  if ((*(long *)((long)pvVar1 + 0x830) == 0) ||
     (iVar2 = regex_is_match(*(regex_handle **)((long)pvVar1 + 0x830),callsign), iVar2 == 0)) {
    if ((*(long *)((long)pvVar1 + 0x828) == 0) ||
       (iVar2 = regex_is_match(*(regex_handle **)((long)pvVar1 + 0x828),callsign), iVar2 == 1)) {
      ph_local._4_4_ = 1;
    }
    else {
      if (iVar2 < 0) {
        pcVar3 = strerror(-iVar2);
        proxy_log(ph,LOG_LEVEL_WARN,
                  "Failed to match callsign \'%s\' against allowing pattern (%d): %s\n",callsign,
                  (ulong)(uint)-iVar2,pcVar3);
      }
      ph_local._4_4_ = 0;
    }
  }
  else {
    if (iVar2 < 0) {
      pcVar3 = strerror(-iVar2);
      proxy_log(ph,LOG_LEVEL_WARN,
                "Failed to match callsign \'%s\' against denial pattern (%d): %s\n",callsign,
                (ulong)(uint)-iVar2,pcVar3);
    }
    ph_local._4_4_ = 0;
  }
  return ph_local._4_4_;
}

Assistant:

int proxy_authorize_callsign(struct proxy_handle *ph,
			     const char *callsign)
{
	struct proxy_priv *priv = ph->priv;
	int ret;

	if (priv->re_calls_denied != NULL) {
		ret = regex_is_match(priv->re_calls_denied, callsign);
		if (ret != 0) {
			if (ret < 0)
				proxy_log(ph, LOG_LEVEL_WARN,
					  "Failed to match callsign '%s' against denial pattern (%d): %s\n",
					  callsign, -ret, strerror(-ret));

			return 0;
		}
	}

	if (priv->re_calls_allowed != NULL) {
		ret = regex_is_match(priv->re_calls_allowed, callsign);
		if (ret != 1) {
			if (ret < 0)
				proxy_log(ph, LOG_LEVEL_WARN,
					  "Failed to match callsign '%s' against allowing pattern (%d): %s\n",
					  callsign, -ret, strerror(-ret));

			return 0;
		}
	}

	return 1;
}